

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,false,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  uint64_t uVar3;
  long lVar4;
  sel_t *psVar5;
  uint64_t uVar6;
  long lVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t *piVar11;
  ulong uVar12;
  sel_t sVar13;
  ulong uVar14;
  unsigned_long uVar15;
  ulong uVar16;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar8 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,false,true,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar8;
    }
    if (count + 0x3f < 0x40) {
      iVar8 = 0;
    }
    else {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar8 = 0;
      uVar12 = 0;
      uVar9 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar15 = 0xffffffffffffffff;
        }
        else {
          uVar15 = puVar1[uVar12];
        }
        uVar16 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar16 = count;
        }
        uVar10 = uVar16;
        if (uVar15 != 0) {
          uVar10 = uVar9;
          if (uVar15 == 0xffffffffffffffff) {
            if (uVar9 < uVar16) {
              psVar2 = sel->sel_vector;
              uVar3 = rdata->lower;
              lVar4 = rdata->upper;
              psVar5 = true_sel->sel_vector;
              piVar11 = &ldata[uVar9].upper;
              do {
                uVar9 = uVar10;
                if (psVar2 != (sel_t *)0x0) {
                  uVar9 = (ulong)psVar2[uVar10];
                }
                uVar6 = ((hugeint_t *)(piVar11 + -1))->lower;
                lVar7 = *piVar11;
                psVar5[iVar8] = (sel_t)uVar9;
                iVar8 = iVar8 + (lVar7 != lVar4 || uVar6 != uVar3);
                uVar10 = uVar10 + 1;
                piVar11 = piVar11 + 2;
              } while (uVar16 != uVar10);
            }
          }
          else if (uVar9 < uVar16) {
            psVar2 = sel->sel_vector;
            psVar5 = true_sel->sel_vector;
            piVar11 = &ldata[uVar9].upper;
            uVar10 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar13 = (int)uVar9 + (int)uVar10;
              }
              else {
                sVar13 = psVar2[uVar9 + uVar10];
              }
              if ((uVar15 >> (uVar10 & 0x3f) & 1) == 0) {
                uVar14 = 0;
              }
              else {
                uVar14 = (ulong)(*piVar11 != rdata->upper ||
                                ((hugeint_t *)(piVar11 + -1))->lower != rdata->lower);
              }
              psVar5[iVar8] = sVar13;
              iVar8 = iVar8 + uVar14;
              uVar10 = uVar10 + 1;
              piVar11 = piVar11 + 2;
            } while ((uVar9 - uVar16) + uVar10 != 0);
            uVar10 = uVar9 + uVar10;
          }
        }
        uVar12 = uVar12 + 1;
        uVar9 = uVar10;
      } while (uVar12 != count + 0x3f >> 6);
    }
  }
  else {
    iVar8 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,false,true,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar8;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}